

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticArray.h
# Opt level: O0

void __thiscall
Corrade::Containers::Implementation::
StaticArrayData<3UL,_Corrade::Containers::BasicStringView<const_char>,_false>::~StaticArrayData
          (StaticArrayData<3UL,_Corrade::Containers::BasicStringView<const_char>,_false> *this)

{
  BasicStringView<const_char> *i;
  BasicStringView<const_char> *__end0;
  BasicStringView<const_char> *__begin0;
  BasicStringView<const_char> (*__range3) [3];
  StaticArrayData<3UL,_Corrade::Containers::BasicStringView<const_char>,_false> *this_local;
  
  for (__end0 = (BasicStringView<const_char> *)this;
      __end0 != (BasicStringView<const_char> *)(this + 1); __end0 = __end0 + 1) {
  }
  return;
}

Assistant:

StaticArrayData<size_, T, false>::~StaticArrayData() {
    for(T& i: _data) {
        i.~T();
        #ifdef CORRADE_MSVC2015_COMPATIBILITY
        /* Complains i is set but not used for trivially destructible types */
        static_cast<void>(i);
        #endif
    }
}